

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_duck_schema.cpp
# Opt level: O2

void __thiscall duckdb::ArrowType::SetRunEndEncoded(ArrowType *this)

{
  pointer this_00;
  ArrowStructInfo *this_01;
  ArrowType *this_02;
  LogicalType actual_type;
  
  this_00 = unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>::
            operator->(&this->type_info);
  this_01 = ArrowTypeInfo::Cast<duckdb::ArrowStructInfo>(this_00);
  this_02 = ArrowStructInfo::GetChild(this_01,1);
  GetDuckType(&actual_type,this_02,false);
  LogicalType::operator=(&this->type,&actual_type);
  this->run_end_encoded = true;
  LogicalType::~LogicalType(&actual_type);
  return;
}

Assistant:

void ArrowType::SetRunEndEncoded() {
	D_ASSERT(type_info);
	D_ASSERT(type_info->type == ArrowTypeInfoType::STRUCT);
	auto &struct_info = type_info->Cast<ArrowStructInfo>();
	D_ASSERT(struct_info.ChildCount() == 2);

	auto actual_type = struct_info.GetChild(1).GetDuckType();
	// Override the duckdb type to the actual type
	type = actual_type;
	run_end_encoded = true;
}